

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

long CVariableInt::Decompress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  int *piVar1;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  uchar *in_RDI;
  int *pDstEnd;
  int *pDst;
  uchar *pEnd;
  uchar *pSrc;
  undefined8 in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int *pInOut;
  uchar *local_30;
  
  dbg_assert_imp(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (int)in_stack_ffffffffffffffb8,(char *)0x133e17);
  piVar1 = (int *)((long)in_RDX + ((long)in_ECX & 0xfffffffffffffffcU));
  pInOut = in_RDX;
  local_30 = in_RDI;
  while( true ) {
    if (in_RDI + in_ESI <= local_30) {
      return (long)pInOut - (long)in_RDX;
    }
    if (piVar1 <= pInOut) break;
    local_30 = Unpack(local_30,pInOut);
    pInOut = pInOut + 1;
  }
  return -1;
}

Assistant:

long CVariableInt::Decompress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(DstSize % sizeof(int) == 0, "invalid bounds");

	const unsigned char *pSrc = (unsigned char *)pSrc_;
	const unsigned char *pEnd = pSrc + SrcSize;
	int *pDst = (int *)pDst_;
	const int *pDstEnd = pDst + DstSize / sizeof(int);
	while(pSrc < pEnd)
	{
		if(pDst >= pDstEnd)
			return -1;
		pSrc = CVariableInt::Unpack(pSrc, pDst);
		pDst++;
	}
	return (long)((unsigned char *)pDst - (unsigned char *)pDst_);
}